

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluConfigInfo.cpp
# Opt level: O1

void eglu::queryExtConfigInfo(Library *egl,EGLDisplay display,EGLConfig config,ConfigInfo *dst)

{
  pointer pbVar1;
  deUint32 dVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  getDisplayExtensions_abi_cxx11_(&local_40,(eglu *)egl,(Library *)display,dst);
  pbVar1 = local_40.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                    (local_40.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_40.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"EGL_EXT_yuv_surface");
  if (_Var3._M_current != pbVar1) {
    (*egl->_vptr_Library[0x19])(egl,display,config,0x3301,dst + 0x7c);
    (*egl->_vptr_Library[0x19])(egl,display,config,0x3311,dst + 0x80);
    (*egl->_vptr_Library[0x19])(egl,display,config,0x3312,dst + 0x84);
    (*egl->_vptr_Library[0x19])(egl,display,config,0x3317,dst + 0x88);
    (*egl->_vptr_Library[0x19])(egl,display,config,0x330a,dst + 0x8c);
    (*egl->_vptr_Library[0x19])(egl,display,config,0x331a,dst + 0x90);
    dVar2 = (*egl->_vptr_Library[0x1f])(egl);
    checkError(dVar2,"Failed to query EGL_EXT_yuv_surface config attribs",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluConfigInfo.cpp"
               ,0x88);
  }
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[27]>>
                    (local_40.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_40.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"EGL_EXT_pixel_format_float");
  if (_Var3._M_current ==
      local_40.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    *(undefined4 *)(dst + 0x94) = 0x333a;
  }
  else {
    (*egl->_vptr_Library[0x19])(egl,display,config,0x3339,dst + 0x94);
    dVar2 = (*egl->_vptr_Library[0x1f])(egl);
    checkError(dVar2,"Failed to query EGL_EXT_pixel_format_float config attribs",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluConfigInfo.cpp"
               ,0x8f);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  return;
}

Assistant:

void queryExtConfigInfo (const eglw::Library& egl, eglw::EGLDisplay display, eglw::EGLConfig config, ConfigInfo* dst)
{
	const std::vector<std::string>	extensions	= getDisplayExtensions(egl, display);

	if (de::contains(extensions.begin(), extensions.end(), "EGL_EXT_yuv_surface"))
	{
		egl.getConfigAttrib(display, config, EGL_YUV_ORDER_EXT,				(EGLint*)&dst->yuvOrder);
		egl.getConfigAttrib(display, config, EGL_YUV_NUMBER_OF_PLANES_EXT,	(EGLint*)&dst->yuvNumberOfPlanes);
		egl.getConfigAttrib(display, config, EGL_YUV_SUBSAMPLE_EXT,			(EGLint*)&dst->yuvSubsample);
		egl.getConfigAttrib(display, config, EGL_YUV_DEPTH_RANGE_EXT,		(EGLint*)&dst->yuvDepthRange);
		egl.getConfigAttrib(display, config, EGL_YUV_CSC_STANDARD_EXT,		(EGLint*)&dst->yuvCscStandard);
		egl.getConfigAttrib(display, config, EGL_YUV_PLANE_BPP_EXT,			(EGLint*)&dst->yuvPlaneBpp);

		EGLU_CHECK_MSG(egl, "Failed to query EGL_EXT_yuv_surface config attribs");
	}

	if (de::contains(extensions.begin(), extensions.end(), "EGL_EXT_pixel_format_float"))
	{
		egl.getConfigAttrib(display, config, EGL_COLOR_COMPONENT_TYPE_EXT,	(EGLint*)&dst->colorComponentType);

		EGLU_CHECK_MSG(egl, "Failed to query EGL_EXT_pixel_format_float config attribs");
	}
	else
		dst->colorComponentType = EGL_COLOR_COMPONENT_TYPE_FIXED_EXT;
}